

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O2

REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_GLOB *__ptr;
  REF_DBL *__ptr_00;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  
  uVar5 = ref_cloud->n;
  if (ref_cloud->max == uVar5) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    __ptr = ref_cloud->global;
    if (0 < (long)ref_cloud->max) {
      __ptr = (REF_GLOB *)realloc(__ptr,(long)ref_cloud->max << 3);
      ref_cloud->global = __ptr;
    }
    if (__ptr == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x58,
             "ref_cloud_store","realloc ref_cloud->global NULL");
      uVar5 = ref_cloud->max;
    }
    else {
      fflush(_stdout);
      uVar5 = ref_cloud->max * ref_cloud->naux;
      __ptr_00 = ref_cloud->aux;
      if (0 < (int)uVar5) {
        __ptr_00 = (REF_DBL *)realloc(__ptr_00,(ulong)uVar5 << 3);
        ref_cloud->aux = __ptr_00;
      }
      if (__ptr_00 != (REF_DBL *)0x0) {
        uVar5 = ref_cloud->n;
        goto LAB_001db5de;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x5a,
             "ref_cloud_store","realloc ref_cloud->aux NULL");
      uVar5 = ref_cloud->max * ref_cloud->naux;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar5,(long)(int)uVar5,
           8,(long)(int)uVar5 * 8);
    RVar4 = 2;
  }
  else {
LAB_001db5de:
    uVar11 = (ulong)uVar5;
    uVar7 = uVar5 + 1;
    do {
      iVar6 = (int)uVar11;
      if (iVar6 < 1) {
        uVar7 = 0;
        break;
      }
      lVar10 = uVar11 - 1;
      if (ref_cloud->global[lVar10] == global) {
        uVar5 = ref_cloud->naux;
        uVar11 = 0;
        if (0 < (int)uVar5) {
          uVar11 = (ulong)uVar5;
        }
        for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
          ref_cloud->aux[(long)(int)((iVar6 + -1) * uVar5) + uVar8] = aux[uVar8];
        }
        return 0;
      }
      uVar7 = uVar7 - 1;
      uVar11 = uVar11 - 1;
    } while (global <= ref_cloud->global[lVar10]);
    for (lVar10 = (long)(int)uVar5; uVar3 = uVar5, uVar2 = uVar5, (long)(ulong)uVar7 < lVar10;
        lVar10 = lVar10 + -1) {
      ref_cloud->global[lVar10] = ref_cloud->global[lVar10 + -1];
    }
    while (uVar2 = uVar2 - 1, (int)uVar7 < (int)uVar3) {
      uVar1 = ref_cloud->naux;
      uVar9 = uVar3 - 1;
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      lVar10 = (long)(int)(uVar3 * uVar1);
      lVar12 = (long)(int)(uVar1 * uVar2);
      while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, uVar3 = uVar9, bVar13) {
        ref_cloud->aux[lVar10] = ref_cloud->aux[lVar12];
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 1;
      }
    }
    ref_cloud->n = uVar5 + 1;
    ref_cloud->global[uVar7] = global;
    uVar5 = ref_cloud->naux;
    RVar4 = 0;
    uVar11 = 0;
    if (0 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    if (iVar6 < 1) {
      iVar6 = RVar4;
    }
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      ref_cloud->aux[(long)(int)(iVar6 * uVar5) + uVar8] = aux[uVar8];
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud, REF_GLOB global,
                                   REF_DBL *aux) {
  REF_INT item, i, insert_point;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  insert_point = 0;
  for (item = ref_cloud_n(ref_cloud) - 1; item >= 0; item--) {
    if (ref_cloud_global(ref_cloud, item) == global) { /* replace aux */
      each_ref_cloud_aux(ref_cloud, i) {
        ref_cloud_aux(ref_cloud, i, item) = aux[i];
      }
      return REF_SUCCESS;
    }
    if (ref_cloud_global(ref_cloud, item) < global) {
      insert_point = item + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    ref_cloud_global(ref_cloud, item) = ref_cloud_global(ref_cloud, item - 1);
  }
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(ref_cloud, i, item - 1);
    }
  }
  /* fill insert_point */
  ref_cloud_n(ref_cloud)++;
  item = insert_point;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}